

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACEncode.h
# Opt level: O1

void inflating<std::ofstream>
               (FreqTable *freqs,BitInStream *bitin,
               basic_ofstream<char,_std::char_traits<char>_> *out,int minLen)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  int iVar3;
  Inflate inf;
  Inflate local_a0;
  
  iVar2 = minLen;
  Inflate::Inflate(&local_a0,0x10,bitin);
  iVar3 = 0;
  __buf = extraout_RDX;
  do {
    Inflate::read(&local_a0,(int)freqs,__buf,CONCAT44(in_register_0000000c,iVar2));
    if ((((iVar3 < minLen + -1) || (local_a0.readingDone != true)) || (bitin->streamDone != true))
       || (0 < bitin->remBits)) {
      std::ostream::put((char)out);
      iVar3 = iVar3 + 1;
      bVar1 = true;
      __buf = extraout_RDX_01;
    }
    else {
      std::ostream::put((char)out);
      bVar1 = false;
      __buf = extraout_RDX_00;
    }
  } while (bVar1);
  return;
}

Assistant:

void inflating(FreqTable &freqs, BitInStream &bitin, T &out, int minLen = 0) {
    Inflate inf(16, bitin);
    bool flag = false;
    int len = 0;
    while (true) {
        int sym = inf.read(freqs);
        if (len >= minLen - 1) {
            if (inf.readingDone) {
                if(bitin.streamDone && (bitin.remBits <= 0)){
                    out.put(char(sym));
                    break;
                }
            }
        }
        out.put(char(sym));
        len++;
    }
}